

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  uint32_t *puVar1;
  global_State *g;
  ulong uVar2;
  uint uVar3;
  uint64_t u;
  TValue *pTVar4;
  GCproto *pt;
  
  g = (global_State *)(L->glref).ptr64;
  puVar1 = &g[1].tmptv.field_4.it;
  *puVar1 = *puVar1 & 0xffffffef;
  if ((g->hookmask & 0x40) != 0) {
    lj_err_caller(L,LJ_ERR_NOGCMM);
  }
  uVar3 = mode & 0xff;
  if (uVar3 < 5) {
    if (uVar3 - 2 < 3) {
      if (idx == 0) {
        pTVar4 = L->base;
        uVar2 = pTVar4[-1].u64;
        if ((uVar2 & 3) == 0) {
          pTVar4 = pTVar4 + (-3 - (ulong)*(byte *)(uVar2 - 3));
        }
        else {
          pTVar4 = (TValue *)((long)pTVar4 + (-8 - (uVar2 & 0xfffffffffffffff8)));
        }
        pTVar4 = pTVar4 + -1;
      }
      else if (idx < 1) {
        pTVar4 = L->top + idx;
      }
      else {
        pTVar4 = L->base + ((ulong)(uint)idx - 1);
      }
      if (((idx == 0) || ((pTVar4->u64 & 0xffff800000000000) == 0xfffb800000000000)) &&
         (*(char *)((pTVar4->u64 & 0x7fffffffffff) + 10) == '\0')) {
        pt = (GCproto *)(*(long *)((pTVar4->u64 & 0x7fffffffffff) + 0x20) + -0x68);
      }
      else {
        if ((pTVar4->u64 & 0xffff800000000000) != 0xfffc000000000000) {
          return 0;
        }
        pt = (GCproto *)(pTVar4->u64 & 0x7fffffffffff);
      }
      if (((mode & 0xffU) != 4) && (setptmode(g,pt,mode), (mode & 0xffU) == 2)) {
        return 1;
      }
      setptmode_all(g,pt,mode);
    }
    else {
      if (uVar3 != 0) {
        return 0;
      }
      if (((uint)mode >> 9 & 1) == 0) {
        g[1].str.id = (uint)mode >> 8 & 1 | g[1].str.id & 0xfffffffe;
        lj_dispatch_update(g);
      }
      else {
        lj_trace_flushall(L);
      }
    }
  }
  else if (uVar3 == 5) {
    if (((uint)mode >> 9 & 1) == 0) {
      return 0;
    }
    lj_trace_flush((jit_State *)(g + 1),idx);
  }
  else {
    if (uVar3 != 0x10) {
      return 0;
    }
    if (((uint)mode >> 8 & 1) == 0) {
      g->bc_cfunc_ext = 0x5f;
    }
    else {
      if (idx == 0) {
        return 0;
      }
      if (idx < 1) {
        pTVar4 = L->top + idx;
      }
      else {
        pTVar4 = L->base + ((ulong)(uint)idx - 1);
      }
      uVar2 = pTVar4->u64;
      if ((uint)(uVar2 >> 0x2f) != 0x1fffc) {
        return 0;
      }
      g->wrapf = (lua_CFunction)
                 (uVar2 & 0x7fffffffff |
                 (ulong)*(uint *)((g->gc).lightudseg.ptr64 + (uVar2 >> 0x27 & 0xff) * 4) << 0x20);
      g->bc_cfunc_ext = 0x60;
    }
  }
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1)-LJ_FR2 :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(g, tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}